

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O1

int Cbs_ManSolve_rec(Cbs_Man_t *p,int Level)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  Gia_Man_t *pGVar5;
  int iVar6;
  int iVar7;
  Gia_Obj_t **ppGVar8;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pGVar10;
  int iVar11;
  uint uVar12;
  int Level_00;
  uint uVar13;
  Gia_Obj_t *pGVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  
  if ((p->pProp).iHead == (p->pProp).iTail) {
    __assert_fail("!Cbs_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x372,"int Cbs_ManSolve_rec(Cbs_Man_t *, int)");
  }
  iVar6 = Cbs_ManPropagate(p,Level);
  if (iVar6 != 0) {
    return iVar6;
  }
  iVar6 = (p->pProp).iHead;
  if (iVar6 != (p->pProp).iTail) {
    __assert_fail("Cbs_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x376,"int Cbs_ManSolve_rec(Cbs_Man_t *, int)");
  }
  iVar2 = (p->pJust).iHead;
  iVar3 = (p->pJust).iTail;
  if (iVar2 == iVar3) {
    return 0;
  }
  iVar7 = (p->Pars).nJustThis;
  iVar11 = (p->pJust).iTail - iVar2;
  if (iVar11 < iVar7) {
    iVar11 = iVar7;
  }
  (p->Pars).nJustThis = iVar11;
  if ((p->Pars).nJustLimit < iVar11) {
    return 0;
  }
  if ((p->Pars).nBTLimit < (p->Pars).nBTThis) {
    return 0;
  }
  lVar16 = (long)iVar3;
  if (iVar2 < iVar3) {
    lVar15 = (long)iVar2;
    do {
      ppGVar8 = (p->pJust).pData;
      pGVar10 = ppGVar8[lVar15];
      if (((ulong)pGVar10 & 1) != 0) {
        __assert_fail("!Gia_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                      ,0x120,"void Cbs_QuePush(Cbs_Que_t *, Gia_Obj_t *)");
      }
      iVar7 = (p->pJust).nSize;
      if ((p->pJust).iTail == iVar7) {
        (p->pJust).nSize = iVar7 * 2;
        if (ppGVar8 == (Gia_Obj_t **)0x0) {
          ppGVar8 = (Gia_Obj_t **)malloc((long)iVar7 << 4);
        }
        else {
          ppGVar8 = (Gia_Obj_t **)realloc(ppGVar8,(long)iVar7 << 4);
        }
        (p->pJust).pData = ppGVar8;
      }
      iVar7 = (p->pJust).iTail;
      (p->pJust).iTail = iVar7 + 1;
      (p->pJust).pData[iVar7] = pGVar10;
      lVar15 = lVar15 + 1;
    } while (lVar16 != lVar15);
  }
  (p->pJust).iHead = iVar3;
  if ((p->Pars).fUseHighest == 0) {
    if ((p->Pars).fUseLowest == 0) {
      if ((p->Pars).fUseMaxFF == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                      ,0x387,"int Cbs_ManSolve_rec(Cbs_Man_t *, int)");
      }
      pGVar10 = Cbs_ManDecideMaxFF(p);
      goto LAB_00712c3e;
    }
    iVar7 = (p->pJust).iTail;
    if (iVar3 < iVar7) {
      pGVar10 = (Gia_Obj_t *)0x0;
      do {
        pGVar14 = (p->pJust).pData[lVar16];
        if (pGVar14 == (Gia_Obj_t *)0x0) break;
        pGVar9 = pGVar10;
        if (pGVar14 < pGVar10) {
          pGVar9 = pGVar14;
        }
        bVar17 = pGVar10 == (Gia_Obj_t *)0x0;
        pGVar10 = pGVar9;
        if (bVar17) {
          pGVar10 = pGVar14;
        }
        lVar16 = lVar16 + 1;
      } while (iVar7 != lVar16);
      goto LAB_00712c3e;
    }
  }
  else {
    iVar7 = (p->pJust).iTail;
    if (iVar3 < iVar7) {
      pGVar10 = (Gia_Obj_t *)0x0;
      do {
        pGVar14 = (p->pJust).pData[lVar16];
        if (pGVar14 == (Gia_Obj_t *)0x0) break;
        if (pGVar10 < pGVar14) {
          pGVar10 = pGVar14;
        }
        lVar16 = lVar16 + 1;
      } while (iVar7 != lVar16);
      goto LAB_00712c3e;
    }
  }
  pGVar10 = (Gia_Obj_t *)0x0;
LAB_00712c3e:
  uVar4 = *(ulong *)pGVar10;
  if (((((int)(uint)uVar4 < 0) || (uVar12 = (uint)uVar4 & 0x1fffffff, uVar12 == 0x1fffffff)) ||
      ((pGVar10[-(ulong)uVar12].field_0x3 & 0x40) != 0)) ||
     (uVar13 = (uint)(uVar4 >> 0x20), (pGVar10[-(ulong)(uVar13 & 0x1fffffff)].field_0x3 & 0x40) != 0
     )) {
    __assert_fail("Cbs_VarIsJust( pVar )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x388,"int Cbs_ManSolve_rec(Cbs_Man_t *, int)");
  }
  pGVar5 = p->pAig;
  pGVar14 = pGVar10 + -(ulong)uVar12;
  pGVar9 = pGVar5->pObjs;
  if (((pGVar9 <= pGVar14) && (pGVar14 < pGVar9 + pGVar5->nObjs)) &&
     ((pGVar10 = pGVar10 + -(ulong)(uVar13 & 0x1fffffff), pGVar9 <= pGVar10 &&
      (pGVar10 < pGVar9 + pGVar5->nObjs)))) {
    iVar11 = pGVar5->pRefs[(int)((ulong)((long)pGVar14 - (long)pGVar9) >> 2) * -0x55555555];
    iVar7 = pGVar5->pRefs[(int)((ulong)((long)pGVar10 - (long)pGVar9) >> 2) * -0x55555555];
    if (iVar7 < iVar11) {
      pGVar10 = pGVar14;
    }
    pGVar14 = (Gia_Obj_t *)
              ((ulong)((uVar4 >> ((iVar11 <= iVar7) << 5 | 0x1dU) & 1) != 0) ^ (ulong)pGVar10);
    Level_00 = Level + 1;
    Cbs_ManAssign(p,(Gia_Obj_t *)((ulong)pGVar14 ^ 1),Level_00,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
    iVar11 = Cbs_ManSolve_rec(p,Level_00);
    iVar7 = 0;
    if ((iVar11 != 0) &&
       (iVar7 = iVar11,
       (p->pClauses).pData[iVar11] == (Gia_Obj_t *)((ulong)pGVar10 & 0xfffffffffffffffe))) {
      Cbs_ManCancelUntil(p,iVar6);
      (p->pJust).iHead = iVar2;
      (p->pJust).iTail = iVar3;
      Cbs_ManAssign(p,pGVar14,Level_00,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
      iVar6 = Cbs_ManSolve_rec(p,Level_00);
      iVar7 = 0;
      if ((iVar6 != 0) &&
         (ppGVar8 = (p->pClauses).pData, iVar7 = iVar6,
         ppGVar8[iVar6] == (Gia_Obj_t *)((ulong)pGVar10 & 0xfffffffffffffffe))) {
        iVar7 = Cbs_ManResolve(p,iVar11,iVar6,(int)ppGVar8);
        piVar1 = &(p->Pars).nBTThis;
        *piVar1 = *piVar1 + 1;
      }
    }
    return iVar7;
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Cbs_ManSolve_rec( Cbs_Man_t * p, int Level )
{ 
    Cbs_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pVar = NULL, * pDecVar;
    int hClause, hLearn0, hLearn1;
    int iPropHead, iJustHead, iJustTail;
    // propagate assignments
    assert( !Cbs_QueIsEmpty(&p->pProp) );
    if ( (hClause = Cbs_ManPropagate( p, Level )) )
        return hClause;
    // check for satisfying assignment
    assert( Cbs_QueIsEmpty(&p->pProp) );
    if ( Cbs_QueIsEmpty(&p->pJust) )
        return 0;
    // quit using resource limits
    p->Pars.nJustThis = Abc_MaxInt( p->Pars.nJustThis, p->pJust.iTail - p->pJust.iHead );
    if ( Cbs_ManCheckLimits( p ) )
        return 0;
    // remember the state before branching
    iPropHead = p->pProp.iHead;
    Cbs_QueStore( &p->pJust, &iJustHead, &iJustTail );
    // find the decision variable
    if ( p->Pars.fUseHighest )
        pVar = Cbs_ManDecideHighest( p );
    else if ( p->Pars.fUseLowest )
        pVar = Cbs_ManDecideLowest( p );
    else if ( p->Pars.fUseMaxFF )
        pVar = Cbs_ManDecideMaxFF( p );
    else assert( 0 );
    assert( Cbs_VarIsJust( pVar ) );
    // chose decision variable using fanout count
    if ( Gia_ObjRefNum(p->pAig, Gia_ObjFanin0(pVar)) > Gia_ObjRefNum(p->pAig, Gia_ObjFanin1(pVar)) )
        pDecVar = Gia_Not(Gia_ObjChild0(pVar));
    else
        pDecVar = Gia_Not(Gia_ObjChild1(pVar));
//    pDecVar = Gia_NotCond( Gia_Regular(pDecVar), Gia_Regular(pDecVar)->fPhase );
//    pDecVar = Gia_Not(pDecVar);
    // decide on first fanin
    Cbs_ManAssign( p, pDecVar, Level+1, NULL, NULL );
    if ( !(hLearn0 = Cbs_ManSolve_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn0] != Gia_Regular(pDecVar) )
        return hLearn0;
    Cbs_ManCancelUntil( p, iPropHead );
    Cbs_QueRestore( &p->pJust, iJustHead, iJustTail );
    // decide on second fanin
    Cbs_ManAssign( p, Gia_Not(pDecVar), Level+1, NULL, NULL );
    if ( !(hLearn1 = Cbs_ManSolve_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn1] != Gia_Regular(pDecVar) )
        return hLearn1;
    hClause = Cbs_ManResolve( p, Level, hLearn0, hLearn1 );
//    Cbs_ManPrintClauseNew( p, Level, hClause );
//    if ( Level > Cbs_ClauseDecLevel(p, hClause) )
//        p->Pars.nBTThisNc++;
    p->Pars.nBTThis++;
    return hClause;
}